

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_frommesh.cpp
# Opt level: O3

uint __thiscall ON_NgonBoundaryComponent::IsBoundaryVertex(ON_NgonBoundaryComponent *this)

{
  ON_NgonBoundaryComponent *pOVar1;
  ON_NgonBoundaryComponent *pOVar2;
  uint uVar3;
  
  uVar3 = 0;
  if (((((this->m_type == Vertex) && (this->m_face_count == '\0')) &&
       (this->m_attached_count == '\x02')) &&
      ((pOVar1 = this->m_attached_to[0], pOVar1 != (ON_NgonBoundaryComponent *)0x0 &&
       (pOVar2 = this->m_attached_to[1],
       pOVar1 != pOVar2 && pOVar2 != (ON_NgonBoundaryComponent *)0x0)))) &&
     ((pOVar1->m_type == Edge && ((pOVar2->m_type == Edge && (pOVar1->m_face_count == '\x01')))))) {
    uVar3 = (uint)(pOVar2->m_face_count == '\x01');
  }
  return uVar3;
}

Assistant:

unsigned int ON_NgonBoundaryComponent::IsBoundaryVertex() const
{
  return
    ON_NgonBoundaryComponent::Type::Vertex == m_type
    && 0 == m_face_count
    && Internal_IsAttachedToTwo(ON_NgonBoundaryComponent::Type::Edge)
    && 1 == m_attached_to[0]->m_face_count
    && 1 == m_attached_to[1]->m_face_count
    ;
}